

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_actor.hpp
# Opt level: O3

void __thiscall
cpp_properties::
properties_actor<cpp_properties::properties_actor_traits<boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_policy>_>
::~properties_actor(properties_actor<cpp_properties::properties_actor_traits<boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_policy>_>
                    *this)

{
  flat_tree<boost::container::dtl::pair<std::__cxx11::string,std::__cxx11::string>,boost::container::dtl::select1st<std::__cxx11::string>,std::less<std::__cxx11::string>,boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::string,std::__cxx11::string>>>
  local_20 [16];
  
  if ((this->property).super_type.m_initialized == true) {
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<std::__cxx11::string,std::__cxx11::string>,boost::container::dtl::select1st<std::__cxx11::string>,std::less<std::__cxx11::string>,boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_unique<std::__cxx11::string,std::__cxx11::string>
              (local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        this->properties,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(this->property).super_type.m_storage);
  }
  boost::optional_detail::
  optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~optional_base(&(this->property).super_type);
  return;
}

Assistant:

~properties_actor() {
    if (property) {
      emplacer_policy::emplace(properties, std::move(property->first), std::move(property->second));
    }
  }